

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npy.h
# Opt level: O0

void npy::read_magic(istream *istream,uchar *v_major,uchar *v_minor)

{
  int iVar1;
  ulong uVar2;
  runtime_error *prVar3;
  undefined1 local_28 [6];
  uchar local_22;
  undefined1 local_21;
  char buf [8];
  uchar *v_minor_local;
  uchar *v_major_local;
  istream *istream_local;
  
  buf = (char  [8])v_minor;
  std::istream::read((char *)istream,(long)local_28);
  uVar2 = std::ios::operator!((ios *)(istream + *(long *)(*(long *)istream + -0x18)));
  if ((uVar2 & 1) != 0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"io error: failed reading file");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar1 = memcmp(local_28,&magic_string,6);
  if (iVar1 != 0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar3,"this file does not have a valid npy format.");
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  *v_major = local_22;
  *(undefined1 *)buf = local_21;
  return;
}

Assistant:

inline void read_magic(std::istream &istream, unsigned char &v_major, unsigned char &v_minor)
{
    char buf[magic_string_length + 2];
    istream.read(buf, magic_string_length + 2);

    if (!istream)
    {
        throw std::runtime_error("io error: failed reading file");
    }

    if (0 != std::memcmp(buf, magic_string, magic_string_length))
        throw std::runtime_error("this file does not have a valid npy format.");

    v_major = buf[magic_string_length];
    v_minor = buf[magic_string_length + 1];
}